

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O2

multi_ex * CSOAA::process_labels(multi_ex *__return_storage_ptr__,ldf *data,multi_ex *ec_seq_all)

{
  example *peVar1;
  bool bVar2;
  long lVar3;
  size_t j;
  ulong uVar4;
  pointer ppeVar5;
  pointer ppeVar6;
  
  peVar1 = *(ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  bVar2 = ec_is_label_definition(peVar1);
  if (bVar2) {
    process_label(data,peVar1);
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    uVar4 = 1;
    lVar3 = 8;
    while( true ) {
      ppeVar5 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppeVar6 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)ppeVar6 - (long)ppeVar5 >> 3) <= uVar4) break;
      peVar1 = ppeVar5[uVar4];
      bVar2 = ec_is_label_definition(peVar1);
      if (!bVar2) {
        for (; uVar4 < (ulong)((long)ppeVar6 - (long)ppeVar5 >> 3); uVar4 = uVar4 + 1) {
          std::vector<example_*,_std::allocator<example_*>_>::push_back
                    (__return_storage_ptr__,(value_type *)((long)ppeVar5 + lVar3));
          ppeVar5 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          ppeVar6 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                    super__Vector_impl_data._M_finish;
          lVar3 = lVar3 + 8;
        }
        return __return_storage_ptr__;
      }
      process_label(data,peVar1);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 8;
    }
  }
  else {
    std::vector<example_*,_std::allocator<example_*>_>::vector(__return_storage_ptr__,ec_seq_all);
  }
  return __return_storage_ptr__;
}

Assistant:

multi_ex process_labels(ldf& data, const multi_ex& ec_seq_all)
{
  example* ec = ec_seq_all[0];

  // check the first element, if it's not a label, return
  if (!ec_is_label_definition(*ec))
    return ec_seq_all;

  // process the first element as a label
  process_label(data, ec);

  multi_ex ret;
  size_t i = 1;
  // process the rest of the elements that are labels
  for (; i < ec_seq_all.size(); i++)
  {
    ec = ec_seq_all[i];
    if (!ec_is_label_definition(*ec))
    {
      for (size_t j = i; j < ec_seq_all.size(); j++) ret.push_back(ec_seq_all[j]);
      // return index of the first element that is not a label
      return ret;
    }

    process_label(data, ec);
  }

  // all examples were labels return size
  return ret;
}